

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

char * readString(void)

{
  uint uVar1;
  void *__ptr;
  char *pcVar2;
  ulong uVar3;
  
  __ptr = (void *)0x0;
  uVar3 = 0;
  while( true ) {
    uVar1 = getchar();
    if (((char)uVar1 == '\n') || ((uVar1 & 0xff) == 0x20)) break;
    __ptr = realloc(__ptr,uVar3 + 1);
    *(char *)((long)__ptr + uVar3) = (char)uVar1;
    uVar3 = uVar3 + 1;
  }
  pcVar2 = (char *)realloc(__ptr,(ulong)((int)uVar3 + 1));
  pcVar2[uVar3 & 0xffffffff] = '\0';
  return pcVar2;
}

Assistant:

static char* readString(){
    char *ret = NULL;
    char c = getchar();
    int i = 0;
    while(c != ' ' && c != '\n'){
        i++;
        ret = (char *)reallocate(ret, sizeof(char)*i);
        ret[i - 1] = c;
        c = getchar();
    }
    ret = (char *)reallocate(ret, sizeof(char) * (i + 1));
    ret[i] = '\0';
    return ret;
}